

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void lws_context_init_alpn(lws_vhost *vhost)

{
  alpn_ctx *os;
  int iVar1;
  char *comma;
  
  comma = (vhost->tls).alpn;
  if (comma == (char *)0x0) {
    comma = (vhost->context->tls).alpn_default;
  }
  _lws_log(8," Server \'%s\' advertising ALPN: %s\n",vhost->name,comma);
  os = &(vhost->tls).alpn_ctx;
  iVar1 = lws_alpn_comma_to_openssl(comma,os->data,0x16);
  (vhost->tls).alpn_ctx.len = (uint8_t)iVar1;
  SSL_CTX_set_alpn_select_cb((vhost->tls).ssl_ctx,alpn_cb,os);
  return;
}

Assistant:

void
lws_context_init_alpn(struct lws_vhost *vhost)
{
#if defined(LWS_WITH_MBEDTLS) || (defined(OPENSSL_VERSION_NUMBER) && \
				  OPENSSL_VERSION_NUMBER >= 0x10002000L)
	const char *alpn_comma = vhost->context->tls.alpn_default;

	if (vhost->tls.alpn)
		alpn_comma = vhost->tls.alpn;

	lwsl_info(" Server '%s' advertising ALPN: %s\n",
		    vhost->name, alpn_comma);
	vhost->tls.alpn_ctx.len = lws_alpn_comma_to_openssl(alpn_comma,
					vhost->tls.alpn_ctx.data,
					sizeof(vhost->tls.alpn_ctx.data) - 1);

	SSL_CTX_set_alpn_select_cb(vhost->tls.ssl_ctx, alpn_cb,
				   &vhost->tls.alpn_ctx);
#else
	lwsl_err(
		" HTTP2 / ALPN configured but not supported by OpenSSL 0x%lx\n",
		    OPENSSL_VERSION_NUMBER);
#endif // OPENSSL_VERSION_NUMBER >= 0x10002000L
}